

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  ostream *poVar1;
  undefined1 local_408 [8];
  cmGeneratedFileStream depFileStream;
  ostringstream local_190 [8];
  ostringstream msg;
  string *file_local;
  cmDepends *this_local;
  
  if ((this->Verbose & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"Clearing dependencies in \"");
    poVar1 = std::operator<<(poVar1,(string *)file);
    poVar1 = std::operator<<(poVar1,"\".");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    cmSystemTools::Stdout((string *)&depFileStream.field_0x240);
    std::__cxx11::string::~string((string *)&depFileStream.field_0x240);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_408,file,false,None);
  poVar1 = std::operator<<((ostream *)local_408,"# Empty dependencies file\n");
  poVar1 = std::operator<<(poVar1,"# This may be replaced when dependencies are built.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_408);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file)
{
  // Print verbose output.
  if (this->Verbose) {
    std::ostringstream msg;
    msg << "Clearing dependencies in \"" << file << "\"." << std::endl;
    cmSystemTools::Stdout(msg.str());
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                << "# This may be replaced when dependencies are built."
                << std::endl;
}